

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testAffinity.cxx
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> cpus;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  _Stack_38;
  
  cmAffinity::GetProcessorsAvailable();
  if (_Stack_38._M_impl.super__Rb_tree_header._M_node_count == 0) {
    lVar2 = 0x2d;
    pcVar3 = "CPU affinity not supported on this platform.\n";
    poVar1 = (ostream *)&std::cout;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"CPU affinity mask count is \'",0x1c);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    lVar2 = 3;
    pcVar3 = "\'.\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&_Stack_38);
  return 0;
}

Assistant:

int main()
{
  std::set<size_t> cpus = cmAffinity::GetProcessorsAvailable();
  if (!cpus.empty()) {
    std::cout << "CPU affinity mask count is '" << cpus.size() << "'.\n";
  } else {
    std::cout << "CPU affinity not supported on this platform.\n";
  }
  return 0;
}